

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall MutatorThread::threadFunc(MutatorThread *this)

{
  pthread_t pVar1;
  
  pVar1 = pthread_self();
  while (this->m_terminateFlag == false) {
    printf("  mutator thread TID:%lld is working...\n",pVar1);
    axl::sys::sleep(200);
    *(undefined4 *)(g_gc->m_guardPage).m_p = 0;
  }
  printf("  mutator thread TID:%lld is finished.\n",pVar1);
  return;
}

Assistant:

void
	threadFunc() {
		uint64_t threadId = sys::getCurrentThreadId();

		GC_BEGIN()

		for (;;) {
			if (m_terminateFlag)
				break;

			printf("  mutator thread TID:%lld is working...\n", threadId);
			sys::sleep(200);
			g_gc->gcSafePoint();
		}

		printf("  mutator thread TID:%lld is finished.\n", threadId);

		GC_END()
	}